

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Signaler::Signal(Signaler *this)

{
  ssize_t sVar1;
  SystemException *this_00;
  int *piVar2;
  allocator local_3a;
  char byte;
  string local_38;
  
  byte = '\0';
  sVar1 = write((this->pipefd_)._M_elems[1],&byte,1);
  if (sVar1 == 1) {
    return;
  }
  this_00 = (SystemException *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string((string *)&local_38,"write pipe",&local_3a);
  piVar2 = __errno_location();
  SystemException::SystemException(this_00,&local_38,*piVar2);
  __cxa_throw(this_00,&SystemException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Signal() {
            char byte = {};
            RESTINCURL_LOG_TRACE("Signal: Signaling!");
            if (write(pipefd_[FD_WRITE], &byte, 1) != 1) {
                throw SystemException("write pipe", errno);
            }
        }